

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O0

double __thiscall fasttext::Meter::precisionAtRecall(Meter *this,int32_t labelId,double recallQuery)

{
  anon_class_16_2_294e78a6 aVar1;
  int32_t in_stack_00000044;
  Meter *in_stack_00000048;
  double bestPrecision;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *precisionRecall;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  *in_stack_ffffffffffffff58;
  __normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<const_std::pair<double,_double>_*,_std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>
  __first;
  double local_40;
  pair<double,_double> local_38;
  pair<double,_double> *local_20;
  
  __first._M_current = &local_38;
  precisionRecallCurve(in_stack_00000048,in_stack_00000044);
  local_40 = 0.0;
  local_20 = __first._M_current;
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::begin
            (in_stack_ffffffffffffff58);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::end
            (in_stack_ffffffffffffff58);
  aVar1.recallQuery = (double)in_stack_ffffffffffffff58;
  aVar1.bestPrecision = (double *)0x1b854a;
  aVar1 = std::
          for_each<__gnu_cxx::__normal_iterator<std::pair<double,double>const*,std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>>,fasttext::Meter::precisionAtRecall(int,double)const::__0>
                    (__first,in_stack_ffffffffffffff60,aVar1);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             aVar1.recallQuery);
  return local_40;
}

Assistant:

double Meter::precisionAtRecall(int32_t labelId, double recallQuery) const {
  const auto& precisionRecall = precisionRecallCurve(labelId);
  double bestPrecision = 0.0;
  std::for_each(
      precisionRecall.begin(),
      precisionRecall.end(),
      [&bestPrecision, recallQuery](const std::pair<double, double>& element) {
        if (element.second >= recallQuery) {
          bestPrecision = std::max(bestPrecision, element.first);
        };
      });
  return bestPrecision;
}